

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlbinary.c
# Opt level: O0

err_t EBML_BinarySetData(ebml_binary *Element,uint8_t *Data,size_t DataSize)

{
  bool_t bVar1;
  size_t DataSize_local;
  uint8_t *Data_local;
  ebml_binary *Element_local;
  
  bVar1 = ArrayResize(&Element->Data,DataSize,0);
  if (bVar1 == 0) {
    Element_local = (ebml_binary *)0xfffffffffffffffe;
  }
  else {
    if (Element == (ebml_binary *)0xffffffffffffff98) {
      __assert_fail("&(Element->Data)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlbinary.c"
                    ,0x6e,"err_t EBML_BinarySetData(ebml_binary *, const uint8_t *, size_t)");
    }
    memcpy((Element->Data)._Begin,Data,DataSize);
    (Element->Base).DataSize = DataSize;
    (Element->Base).bNeedDataSizeUpdate = '\0';
    (Element->Base).bValueIsSet = '\x01';
    Element_local = (ebml_binary *)0x0;
  }
  return (err_t)Element_local;
}

Assistant:

META_END(EBML_ELEMENT_CLASS)

err_t EBML_BinarySetData(ebml_binary *Element, const uint8_t *Data, size_t DataSize)
{
    if (!ArrayResize(&Element->Data,DataSize,0))
        return ERR_OUT_OF_MEMORY;
    memcpy(ARRAYBEGIN(Element->Data,void),Data,DataSize);
    Element->Base.DataSize = DataSize;
    Element->Base.bNeedDataSizeUpdate = 0;
    Element->Base.bValueIsSet = 1;
    return ERR_NONE;
}